

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_BOOL opj_j2k_update_image_data(opj_tcd_t *p_tcd,opj_image_t *p_output_image)

{
  byte bVar1;
  uint uVar2;
  opj_image_t *poVar3;
  opj_tcd_resolution_t *poVar4;
  long lVar5;
  uint uVar6;
  OPJ_INT32 *pOVar7;
  opj_image_comp_t *poVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  opj_tcd_resolution_t *poVar12;
  OPJ_UINT32 *pOVar13;
  uint uVar14;
  opj_image_comp_t *poVar15;
  uint uVar16;
  opj_tcd_tilecomp_t *poVar17;
  uint uVar18;
  OPJ_UINT32 *pOVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  long lVar28;
  long lVar29;
  void *__src;
  bool bVar30;
  long lStack_70;
  
  poVar3 = p_tcd->image;
  poVar17 = p_tcd->tcd_image->tiles->comps;
  poVar15 = poVar3->comps;
  poVar8 = p_output_image->comps;
  uVar11 = 0;
  do {
    if (poVar3->numcomps <= uVar11) {
      return 1;
    }
    uVar9 = poVar15->resno_decoded;
    poVar8->resno_decoded = uVar9;
    poVar4 = poVar17->resolutions;
    poVar12 = poVar4 + uVar9;
    if (p_tcd->whole_tile_decoding == 0) {
      uVar9 = poVar12->win_x0;
      uVar6 = poVar12->win_x1;
      pOVar19 = &poVar12->win_y0;
      pOVar13 = &poVar12->win_y1;
      uVar10 = uVar6 - uVar9;
      lStack_70 = 0x50;
    }
    else {
      uVar9 = poVar12->x0;
      uVar6 = poVar12->x1;
      pOVar19 = (OPJ_UINT32 *)&poVar12->y0;
      pOVar13 = (OPJ_UINT32 *)&poVar12->y1;
      uVar10 = poVar17->minimum_num_resolutions - 1;
      uVar10 = poVar4[uVar10].x1 - poVar4[uVar10].x0;
      lStack_70 = 0x30;
    }
    lVar5 = *(long *)((long)&poVar17->x0 + lStack_70);
    if (lVar5 != 0) {
      bVar1 = (byte)poVar8->factor;
      uVar21 = ~(-1L << (bVar1 & 0x3f));
      if ((int)uVar9 < 0) {
        __assert_fail("res_x0 >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                      ,0x2390,"OPJ_BOOL opj_j2k_update_image_data(opj_tcd_t *, opj_image_t *)");
      }
      if ((int)uVar6 < 0) {
        __assert_fail("res_x1 >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                      ,0x2391,"OPJ_BOOL opj_j2k_update_image_data(opj_tcd_t *, opj_image_t *)");
      }
      uVar22 = uVar6 - uVar9;
      uVar2 = poVar8->w;
      uVar14 = (uint)(poVar8->x0 + uVar21 >> (bVar1 & 0x3f));
      uVar26 = uVar2 + uVar14;
      uVar20 = uVar9 - uVar14;
      if (uVar9 < uVar14 || uVar20 == 0) {
        uVar14 = uVar14 - uVar9;
        iVar23 = uVar6 - uVar26;
        if (uVar6 < uVar26 || iVar23 == 0) {
          uVar22 = uVar22 - uVar14;
          uVar20 = 0;
          goto LAB_00117a1b;
        }
        uVar20 = 0;
        uVar22 = uVar2;
      }
      else {
        uVar14 = 0;
        if (uVar26 < uVar6) {
          iVar23 = uVar22 - (uVar26 - uVar9);
          uVar22 = uVar26 - uVar9;
        }
        else {
LAB_00117a1b:
          iVar23 = 0;
        }
      }
      uVar9 = *pOVar13;
      uVar6 = *pOVar19;
      uVar24 = uVar9 - uVar6;
      uVar26 = poVar8->h;
      uVar16 = (uint)(poVar8->y0 + uVar21 >> (bVar1 & 0x3f));
      uVar27 = uVar26 + uVar16;
      uVar18 = uVar6 - uVar16;
      if (uVar6 < uVar16 || uVar18 == 0) {
        uVar16 = uVar16 - uVar6;
        iVar25 = uVar9 - uVar27;
        if (uVar9 < uVar27 || iVar25 == 0) {
          uVar24 = uVar24 - uVar16;
          uVar18 = 0;
          goto LAB_00117a63;
        }
        uVar18 = 0;
        uVar24 = uVar26;
      }
      else {
        uVar16 = 0;
        if (uVar27 < uVar9) {
          iVar25 = uVar24 - (uVar27 - uVar6);
          uVar24 = uVar27 - uVar6;
        }
        else {
LAB_00117a63:
          iVar25 = 0;
        }
      }
      if ((int)uVar14 < 0) {
        return 0;
      }
      if ((int)uVar16 < 0) {
        return 0;
      }
      if (iVar23 < 0) {
        return 0;
      }
      if (iVar25 < 0) {
        return 0;
      }
      if ((int)uVar22 < 0) {
        return 0;
      }
      if ((int)uVar24 < 0) {
        return 0;
      }
      lVar29 = (ulong)uVar16 * (ulong)uVar10 + (ulong)uVar14;
      lVar28 = (ulong)uVar18 * (ulong)uVar2 + (ulong)uVar20;
      pOVar7 = poVar8->data;
      if ((((pOVar7 == (OPJ_INT32 *)0x0) && (lVar29 == 0)) && (lVar28 == 0)) &&
         ((uVar10 == uVar2 && (uVar22 == uVar2)))) {
        if (uVar24 == uVar26) {
          uVar21 = (ulong)(p_tcd->whole_tile_decoding == 0);
          poVar8->data = (&poVar17->data)[uVar21 * 4];
          (&poVar17->data)[uVar21 * 4] = (OPJ_INT32 *)0x0;
          goto LAB_00117afc;
        }
LAB_00117b22:
        if (uVar26 == 0) {
          return 0;
        }
        uVar21 = (ulong)uVar26 * (ulong)uVar2;
        if (uVar21 >> 0x3e != 0) {
          return 0;
        }
        pOVar7 = (OPJ_INT32 *)opj_image_data_alloc(uVar21 * 4);
        poVar8->data = pOVar7;
        if (pOVar7 == (OPJ_INT32 *)0x0) {
          return 0;
        }
        if ((poVar8->w != uVar22) || (poVar8->h != uVar24)) {
          memset(pOVar7,0,(ulong)poVar8->w * (ulong)poVar8->h * 4);
          pOVar7 = poVar8->data;
        }
      }
      else if (pOVar7 == (OPJ_INT32 *)0x0) goto LAB_00117b22;
      pOVar7 = pOVar7 + lVar28;
      __src = (void *)(lVar5 + lVar29 * 4);
      while (bVar30 = uVar24 != 0, uVar24 = uVar24 - 1, bVar30) {
        memcpy(pOVar7,__src,(ulong)uVar22 << 2);
        pOVar7 = pOVar7 + poVar8->w;
        __src = (void *)((long)__src + (ulong)uVar10 * 4);
      }
    }
LAB_00117afc:
    uVar11 = uVar11 + 1;
    poVar8 = poVar8 + 1;
    poVar15 = poVar15 + 1;
    poVar17 = poVar17 + 1;
  } while( true );
}

Assistant:

static OPJ_BOOL opj_j2k_update_image_data(opj_tcd_t * p_tcd,
        opj_image_t* p_output_image)
{
    OPJ_UINT32 i, j;
    OPJ_UINT32 l_width_src, l_height_src;
    OPJ_UINT32 l_width_dest, l_height_dest;
    OPJ_INT32 l_offset_x0_src, l_offset_y0_src, l_offset_x1_src, l_offset_y1_src;
    OPJ_SIZE_T l_start_offset_src;
    OPJ_UINT32 l_start_x_dest, l_start_y_dest;
    OPJ_UINT32 l_x0_dest, l_y0_dest, l_x1_dest, l_y1_dest;
    OPJ_SIZE_T l_start_offset_dest;

    opj_image_comp_t * l_img_comp_src = 00;
    opj_image_comp_t * l_img_comp_dest = 00;

    opj_tcd_tilecomp_t * l_tilec = 00;
    opj_image_t * l_image_src = 00;
    OPJ_INT32 * l_dest_ptr;

    l_tilec = p_tcd->tcd_image->tiles->comps;
    l_image_src = p_tcd->image;
    l_img_comp_src = l_image_src->comps;

    l_img_comp_dest = p_output_image->comps;

    for (i = 0; i < l_image_src->numcomps;
            i++, ++l_img_comp_dest, ++l_img_comp_src,  ++l_tilec) {
        OPJ_INT32 res_x0, res_x1, res_y0, res_y1;
        OPJ_UINT32 src_data_stride;
        const OPJ_INT32* p_src_data;

        /* Copy info from decoded comp image to output image */
        l_img_comp_dest->resno_decoded = l_img_comp_src->resno_decoded;

        if (p_tcd->whole_tile_decoding) {
            opj_tcd_resolution_t* l_res = l_tilec->resolutions +
                                          l_img_comp_src->resno_decoded;
            res_x0 = l_res->x0;
            res_y0 = l_res->y0;
            res_x1 = l_res->x1;
            res_y1 = l_res->y1;
            src_data_stride = (OPJ_UINT32)(
                                  l_tilec->resolutions[l_tilec->minimum_num_resolutions - 1].x1 -
                                  l_tilec->resolutions[l_tilec->minimum_num_resolutions - 1].x0);
            p_src_data = l_tilec->data;
        } else {
            opj_tcd_resolution_t* l_res = l_tilec->resolutions +
                                          l_img_comp_src->resno_decoded;
            res_x0 = (OPJ_INT32)l_res->win_x0;
            res_y0 = (OPJ_INT32)l_res->win_y0;
            res_x1 = (OPJ_INT32)l_res->win_x1;
            res_y1 = (OPJ_INT32)l_res->win_y1;
            src_data_stride = l_res->win_x1 - l_res->win_x0;
            p_src_data = l_tilec->data_win;
        }

        if (p_src_data == NULL) {
            /* Happens for partial component decoding */
            continue;
        }

        l_width_src = (OPJ_UINT32)(res_x1 - res_x0);
        l_height_src = (OPJ_UINT32)(res_y1 - res_y0);


        /* Current tile component size*/
        /*if (i == 0) {
        fprintf(stdout, "SRC: l_res_x0=%d, l_res_x1=%d, l_res_y0=%d, l_res_y1=%d\n",
                        res_x0, res_x1, res_y0, res_y1);
        }*/


        /* Border of the current output component*/
        l_x0_dest = opj_uint_ceildivpow2(l_img_comp_dest->x0, l_img_comp_dest->factor);
        l_y0_dest = opj_uint_ceildivpow2(l_img_comp_dest->y0, l_img_comp_dest->factor);
        l_x1_dest = l_x0_dest +
                    l_img_comp_dest->w; /* can't overflow given that image->x1 is uint32 */
        l_y1_dest = l_y0_dest + l_img_comp_dest->h;

        /*if (i == 0) {
        fprintf(stdout, "DEST: l_x0_dest=%d, l_x1_dest=%d, l_y0_dest=%d, l_y1_dest=%d (%d)\n",
                        l_x0_dest, l_x1_dest, l_y0_dest, l_y1_dest, l_img_comp_dest->factor );
        }*/

        /*-----*/
        /* Compute the area (l_offset_x0_src, l_offset_y0_src, l_offset_x1_src, l_offset_y1_src)
         * of the input buffer (decoded tile component) which will be move
         * in the output buffer. Compute the area of the output buffer (l_start_x_dest,
         * l_start_y_dest, l_width_dest, l_height_dest)  which will be modified
         * by this input area.
         * */
        assert(res_x0 >= 0);
        assert(res_x1 >= 0);
        if (l_x0_dest < (OPJ_UINT32)res_x0) {
            l_start_x_dest = (OPJ_UINT32)res_x0 - l_x0_dest;
            l_offset_x0_src = 0;

            if (l_x1_dest >= (OPJ_UINT32)res_x1) {
                l_width_dest = l_width_src;
                l_offset_x1_src = 0;
            } else {
                l_width_dest = l_x1_dest - (OPJ_UINT32)res_x0 ;
                l_offset_x1_src = (OPJ_INT32)(l_width_src - l_width_dest);
            }
        } else {
            l_start_x_dest = 0U;
            l_offset_x0_src = (OPJ_INT32)l_x0_dest - res_x0;

            if (l_x1_dest >= (OPJ_UINT32)res_x1) {
                l_width_dest = l_width_src - (OPJ_UINT32)l_offset_x0_src;
                l_offset_x1_src = 0;
            } else {
                l_width_dest = l_img_comp_dest->w ;
                l_offset_x1_src = res_x1 - (OPJ_INT32)l_x1_dest;
            }
        }

        if (l_y0_dest < (OPJ_UINT32)res_y0) {
            l_start_y_dest = (OPJ_UINT32)res_y0 - l_y0_dest;
            l_offset_y0_src = 0;

            if (l_y1_dest >= (OPJ_UINT32)res_y1) {
                l_height_dest = l_height_src;
                l_offset_y1_src = 0;
            } else {
                l_height_dest = l_y1_dest - (OPJ_UINT32)res_y0 ;
                l_offset_y1_src = (OPJ_INT32)(l_height_src - l_height_dest);
            }
        } else {
            l_start_y_dest = 0U;
            l_offset_y0_src = (OPJ_INT32)l_y0_dest - res_y0;

            if (l_y1_dest >= (OPJ_UINT32)res_y1) {
                l_height_dest = l_height_src - (OPJ_UINT32)l_offset_y0_src;
                l_offset_y1_src = 0;
            } else {
                l_height_dest = l_img_comp_dest->h ;
                l_offset_y1_src = res_y1 - (OPJ_INT32)l_y1_dest;
            }
        }

        if ((l_offset_x0_src < 0) || (l_offset_y0_src < 0) || (l_offset_x1_src < 0) ||
                (l_offset_y1_src < 0)) {
            return OPJ_FALSE;
        }
        /* testcase 2977.pdf.asan.67.2198 */
        if ((OPJ_INT32)l_width_dest < 0 || (OPJ_INT32)l_height_dest < 0) {
            return OPJ_FALSE;
        }
        /*-----*/

        /* Compute the input buffer offset */
        l_start_offset_src = (OPJ_SIZE_T)l_offset_x0_src + (OPJ_SIZE_T)l_offset_y0_src
                             * (OPJ_SIZE_T)src_data_stride;

        /* Compute the output buffer offset */
        l_start_offset_dest = (OPJ_SIZE_T)l_start_x_dest + (OPJ_SIZE_T)l_start_y_dest
                              * (OPJ_SIZE_T)l_img_comp_dest->w;

        /* Allocate output component buffer if necessary */
        if (l_img_comp_dest->data == NULL &&
                l_start_offset_src == 0 && l_start_offset_dest == 0 &&
                src_data_stride == l_img_comp_dest->w &&
                l_width_dest == l_img_comp_dest->w &&
                l_height_dest == l_img_comp_dest->h) {
            /* If the final image matches the tile buffer, then borrow it */
            /* directly to save a copy */
            if (p_tcd->whole_tile_decoding) {
                l_img_comp_dest->data = l_tilec->data;
                l_tilec->data = NULL;
            } else {
                l_img_comp_dest->data = l_tilec->data_win;
                l_tilec->data_win = NULL;
            }
            continue;
        } else if (l_img_comp_dest->data == NULL) {
            OPJ_SIZE_T l_width = l_img_comp_dest->w;
            OPJ_SIZE_T l_height = l_img_comp_dest->h;

            if ((l_height == 0U) || (l_width > (SIZE_MAX / l_height)) ||
                    l_width * l_height > SIZE_MAX / sizeof(OPJ_INT32)) {
                /* would overflow */
                return OPJ_FALSE;
            }
            l_img_comp_dest->data = (OPJ_INT32*) opj_image_data_alloc(l_width * l_height *
                                    sizeof(OPJ_INT32));
            if (! l_img_comp_dest->data) {
                return OPJ_FALSE;
            }

            if (l_img_comp_dest->w != l_width_dest ||
                    l_img_comp_dest->h != l_height_dest) {
                memset(l_img_comp_dest->data, 0,
                       (OPJ_SIZE_T)l_img_comp_dest->w * l_img_comp_dest->h * sizeof(OPJ_INT32));
            }
        }

        /* Move the output buffer to the first place where we will write*/
        l_dest_ptr = l_img_comp_dest->data + l_start_offset_dest;

        {
            const OPJ_INT32 * l_src_ptr = p_src_data;
            l_src_ptr += l_start_offset_src;

            for (j = 0; j < l_height_dest; ++j) {
                memcpy(l_dest_ptr, l_src_ptr, l_width_dest * sizeof(OPJ_INT32));
                l_dest_ptr += l_img_comp_dest->w;
                l_src_ptr += src_data_stride;
            }
        }


    }

    return OPJ_TRUE;
}